

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalCommonGenerator::cmLocalCommonGenerator
          (cmLocalCommonGenerator *this,cmGlobalGenerator *gg,cmMakefile *mf,string *wd)

{
  cmMakefile *this_00;
  char *pcVar1;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *config;
  string *wd_local;
  cmMakefile *mf_local;
  cmGlobalGenerator *gg_local;
  cmLocalCommonGenerator *this_local;
  
  config = (char *)wd;
  wd_local = (string *)mf;
  mf_local = (cmMakefile *)gg;
  gg_local = (cmGlobalGenerator *)this;
  cmLocalGenerator::cmLocalGenerator(&this->super_cmLocalGenerator,gg,mf);
  (this->super_cmLocalGenerator)._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalCommonGenerator_009dba88;
  std::__cxx11::string::string((string *)&this->WorkingDirectory,(string *)wd);
  std::__cxx11::string::string((string *)&this->ConfigName);
  this_00 = (this->super_cmLocalGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_BUILD_TYPE",&local_51);
  pcVar1 = cmMakefile::GetDefinition(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_30 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::operator=((string *)&this->ConfigName,pcVar1);
  }
  return;
}

Assistant:

cmLocalCommonGenerator::cmLocalCommonGenerator(cmGlobalGenerator* gg,
                                               cmMakefile* mf, std::string wd)
  : cmLocalGenerator(gg, mf)
  , WorkingDirectory(std::move(wd))
{
  // Store the configuration name that will be generated.
  if (const char* config = this->Makefile->GetDefinition("CMAKE_BUILD_TYPE")) {
    // Use the build type given by the user.
    this->ConfigName = config;
  } else {
    // No configuration type given.
    this->ConfigName.clear();
  }
}